

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_dict(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 uVar10;
  int test_ret_5;
  undefined8 *puVar11;
  int n_sub;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 *puVar15;
  int n_len;
  ulong uVar16;
  int test_ret_6;
  ulong uVar17;
  undefined4 uVar18;
  bool bVar19;
  int test_ret_3;
  int test_ret_4;
  int test_ret_2;
  int test_ret;
  int test_ret_1;
  int local_54;
  ulong local_50;
  uint local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing dict : 10 of 13 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlDictCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDictCleanup",(ulong)(uint)(iVar3 - iVar1));
    putchar(10);
  }
  local_44 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  uVar8 = xmlDictCreate();
  xmlDictFree(uVar8);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDictCreate",(ulong)(uint)(iVar3 - iVar1));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar12 = 0;
  local_40 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar12 == 0) {
      lVar9 = xmlDictCreate();
    }
    else {
      lVar9 = 0;
    }
    uVar8 = xmlDictCreateSub(lVar9);
    xmlDictFree(uVar8);
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlDictFree(lVar9);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDictCreateSub",(ulong)(uint)(iVar4 - iVar3));
      local_40 = local_40 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 == 1);
  function_tests = function_tests + 1;
  local_3c = 0;
  local_50 = 0;
  do {
    uVar17 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00157254;
      do {
        iVar3 = xmlMemBlocks();
        if ((int)local_50 == 0) {
          lVar9 = xmlDictCreate();
        }
        else {
          lVar9 = 0;
        }
        if ((uint)uVar17 < 4) {
          iVar1 = (*(code *)(&DAT_0014b038 + *(int *)(&DAT_0014b038 + uVar17 * 4)))();
          return iVar1;
        }
        uVar18 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar18 = *puVar15;
        }
        xmlDictExists(lVar9,0,uVar18);
        call_tests = call_tests + 1;
        if (lVar9 != 0) {
          xmlDictFree(lVar9);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictExists",(ulong)(uint)(iVar4 - iVar3));
          local_3c = local_3c + 1;
          printf(" %d",local_50);
          printf(" %d",uVar17);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar12 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar12;
        puVar15 = puVar15 + 1;
      } while (uVar12 != 4);
      uVar12 = (uint)uVar17 + 1;
      uVar17 = (ulong)uVar12;
    } while (uVar12 != 5);
    bVar19 = (int)local_50 != 0;
    local_50 = (ulong)((int)local_50 + 1);
    if (bVar19) {
      function_tests = function_tests + 1;
      iVar1 = (iVar1 != iVar2) + local_44;
      local_44 = 0;
      local_50 = 0;
      do {
        uVar17 = 0;
        do {
          uVar16 = 0;
          puVar15 = &DAT_00157254;
          do {
            iVar2 = xmlMemBlocks();
            if ((int)local_50 == 0) {
              lVar9 = xmlDictCreate();
            }
            else {
              lVar9 = 0;
            }
            if ((uint)uVar17 < 4) {
              iVar1 = (*(code *)(&DAT_0014b048 + *(int *)(&DAT_0014b048 + uVar17 * 4)))();
              return iVar1;
            }
            uVar18 = 0xffffffff;
            if ((uint)uVar16 < 4) {
              uVar18 = *puVar15;
            }
            xmlDictLookup(lVar9,0,uVar18);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlDictFree(lVar9);
            }
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar2 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictLookup",(ulong)(uint)(iVar3 - iVar2));
              local_44 = local_44 + 1;
              printf(" %d",local_50);
              printf(" %d",uVar17);
              printf(" %d",uVar16);
              putchar(10);
            }
            uVar12 = (uint)uVar16 + 1;
            uVar16 = (ulong)uVar12;
            puVar15 = puVar15 + 1;
          } while (uVar12 != 4);
          uVar12 = (uint)uVar17 + 1;
          uVar17 = (ulong)uVar12;
        } while (uVar12 != 5);
        bVar19 = (int)local_50 != 0;
        local_50 = (ulong)((int)local_50 + 1);
        if (bVar19) {
          function_tests = function_tests + 1;
          local_54 = 0;
          uVar12 = 0;
          do {
            puVar11 = &DAT_00159d60;
            uVar13 = 0;
            do {
              iVar2 = xmlMemBlocks();
              if (uVar12 == 0) {
                lVar9 = xmlDictCreate();
              }
              else {
                lVar9 = 0;
              }
              if (uVar13 < 4) {
                uVar8 = *puVar11;
              }
              else {
                uVar8 = 0;
              }
              xmlDictOwns(lVar9,uVar8);
              call_tests = call_tests + 1;
              if (lVar9 != 0) {
                xmlDictFree(lVar9);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDictOwns",(ulong)(uint)(iVar3 - iVar2));
                local_54 = local_54 + 1;
                printf(" %d",(ulong)uVar12);
                printf(" %d");
                putchar(10);
              }
              uVar13 = uVar13 + 1;
              puVar11 = puVar11 + 1;
            } while (uVar13 != 5);
            bVar19 = uVar12 == 0;
            uVar12 = uVar12 + 1;
          } while (bVar19);
          function_tests = function_tests + 1;
          iVar2 = 0;
          uVar12 = 0;
          do {
            uVar13 = 0;
            do {
              uVar14 = 0;
              puVar11 = &DAT_00159d60;
              do {
                iVar3 = xmlMemBlocks();
                if (uVar12 == 0) {
                  lVar9 = xmlDictCreate();
                }
                else {
                  lVar9 = 0;
                }
                if (uVar13 < 4) {
                  uVar8 = (&DAT_00159d60)[uVar13];
                }
                else {
                  uVar8 = 0;
                }
                if (uVar14 < 4) {
                  uVar10 = *puVar11;
                }
                else {
                  uVar10 = 0;
                }
                xmlDictQLookup(lVar9,uVar8,uVar10);
                call_tests = call_tests + 1;
                if (lVar9 != 0) {
                  xmlDictFree(lVar9);
                }
                xmlResetLastError();
                iVar4 = xmlMemBlocks();
                if (iVar3 != iVar4) {
                  iVar4 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlDictQLookup",(ulong)(uint)(iVar4 - iVar3));
                  iVar2 = iVar2 + 1;
                  printf(" %d",(ulong)uVar12);
                  printf(" %d",(ulong)uVar13);
                  printf(" %d");
                  putchar(10);
                }
                uVar14 = uVar14 + 1;
                puVar11 = puVar11 + 1;
              } while (uVar14 != 5);
              uVar13 = uVar13 + 1;
            } while (uVar13 != 5);
            bVar19 = uVar12 == 0;
            uVar12 = uVar12 + 1;
          } while (bVar19);
          function_tests = function_tests + 1;
          uVar12 = 0;
          iVar3 = 0;
          do {
            iVar4 = xmlMemBlocks();
            if (uVar12 == 0) {
              lVar9 = xmlDictCreate();
            }
            else {
              lVar9 = 0;
            }
            xmlDictReference(lVar9);
            xmlDictFree(lVar9);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlDictFree(lVar9);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictReference",(ulong)(uint)(iVar5 - iVar4));
              iVar3 = iVar3 + 1;
              printf(" %d",(ulong)uVar12);
              putchar(10);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 == 1);
          function_tests = function_tests + 1;
          uVar12 = 0;
          iVar4 = 0;
          do {
            iVar5 = xmlMemBlocks();
            if (uVar12 == 0) {
              lVar9 = xmlDictCreate();
            }
            else {
              lVar9 = 0;
            }
            xmlDictSize(lVar9);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlDictFree(lVar9);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDictSize",(ulong)(uint)(iVar6 - iVar5));
              iVar4 = iVar4 + 1;
              printf(" %d",(ulong)uVar12);
              putchar(10);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 == 1);
          function_tests = function_tests + 1;
          iVar5 = xmlMemBlocks();
          xmlInitializeDict();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlInitializeDict",(ulong)(uint)(iVar7 - iVar5));
            putchar(10);
          }
          function_tests = function_tests + 1;
          uVar12 = iVar3 + iVar4 + iVar1 + local_40 + local_3c + local_44 + local_54 + iVar2 +
                   (uint)(iVar5 != iVar6);
          if (uVar12 != 0) {
            printf("Module dict: %d errors\n",(ulong)uVar12);
          }
          return uVar12;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
test_dict(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing dict : 10 of 13 functions ...\n");
    test_ret += test_xmlDictCleanup();
    test_ret += test_xmlDictCreate();
    test_ret += test_xmlDictCreateSub();
    test_ret += test_xmlDictExists();
    test_ret += test_xmlDictGetUsage();
    test_ret += test_xmlDictLookup();
    test_ret += test_xmlDictOwns();
    test_ret += test_xmlDictQLookup();
    test_ret += test_xmlDictReference();
    test_ret += test_xmlDictSetLimit();
    test_ret += test_xmlDictSize();
    test_ret += test_xmlInitializeDict();

    if (test_ret != 0)
	printf("Module dict: %d errors\n", test_ret);
    return(test_ret);
}